

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

AssertionResult *
iutest::internal::CmpHelperFloatingPointComplexEQ<double>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,complex<double> *val1,
          complex<double> *val2)

{
  bool bVar1;
  complex<double> *pcVar2;
  floating_point<double> imag2;
  floating_point<double> imag1;
  floating_point<double> real2;
  floating_point<double> real1;
  FInt local_d0;
  FInt local_c8;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  FInt local_40;
  FInt local_38;
  
  local_38 = *(FInt *)val1->_M_value;
  local_40 = *(FInt *)val2->_M_value;
  local_c8 = *(FInt *)(val1->_M_value + 8);
  local_d0 = *(FInt *)(val2->_M_value + 8);
  pcVar2 = val1;
  bVar1 = floating_point<double>::AlmostEquals
                    ((floating_point<double> *)&local_38,(_Myt *)&local_40);
  if ((bVar1) &&
     (bVar1 = floating_point<double>::AlmostEquals
                        ((floating_point<double> *)&local_c8,(_Myt *)&local_d0), bVar1)) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
    return __return_storage_ptr__;
  }
  FormatForComparisonFailureMessage<std::complex<double>,std::complex<double>>
            (&local_60,(internal *)val1,val2,pcVar2);
  detail::ShowStringQuoted(&local_80,&local_60);
  FormatForComparisonFailureMessage<std::complex<double>,std::complex<double>>
            (&local_c0,(internal *)val2,val1,pcVar2);
  detail::ShowStringQuoted(&local_a0,&local_c0);
  EqFailure(__return_storage_ptr__,expr1,expr2,&local_80,&local_a0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperFloatingPointComplexEQ(const char* expr1, const char* expr2
                                                , const ::std::complex<RawType>& val1, const ::std::complex<RawType>& val2)
{
    floating_point<RawType> real1(val1.real()), real2(val2.real());
    floating_point<RawType> imag1(val1.imag()), imag2(val2.imag());
    if IUTEST_COND_LIKELY( real1.AlmostEquals(real2) && imag1.AlmostEquals(imag2) )
    {
        return AssertionSuccess();
    }